

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::addView(QGraphicsScenePrivate *this,QGraphicsView *view)

{
  bool bVar1;
  GestureType *pGVar2;
  const_iterator *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  parameter_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  GestureType in_stack_ffffffffffffffb4;
  const_iterator *this_00;
  undefined1 local_2c [4];
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QList<QGraphicsView_*>::operator<<
            ((QList<QGraphicsView_*> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
             ,in_stack_ffffffffffffffa8);
  local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d = (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (piter)QHash<Qt::GestureType,_int>::constBegin((QHash<Qt::GestureType,_int> *)this_00);
  while( true ) {
    local_28 = (piter)QHash<Qt::GestureType,_int>::constEnd((QHash<Qt::GestureType,_int> *)in_RDI);
    bVar1 = QHash<Qt::GestureType,_int>::const_iterator::operator!=
                      (in_RDI,(const_iterator *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (!bVar1) break;
    QAbstractScrollArea::viewport
              ((QAbstractScrollArea *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    pGVar2 = QHash<Qt::GestureType,_int>::const_iterator::key((const_iterator *)0x9d9b16);
    in_stack_ffffffffffffffb4 = *pGVar2;
    memset(local_2c,0,4);
    QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0x9d9b37);
    QWidget::grabGesture
              ((QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (GestureType)in_RDI,
               (QFlagsStorageHelper<Qt::GestureFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0));
    QHash<Qt::GestureType,_int>::const_iterator::operator++(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::addView(QGraphicsView *view)
{
    views << view;
#ifndef QT_NO_GESTURES
    for (auto it = grabbedGestures.constBegin();
              it != grabbedGestures.constEnd(); ++it)
        view->viewport()->grabGesture(it.key());
#endif
}